

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cost.cpp
# Opt level: O1

void __thiscall iDynTree::optimalcontrol::Cost::Cost(Cost *this,string *costName)

{
  pointer pcVar1;
  
  this->_vptr_Cost = (_func_int **)&PTR__Cost_0019acd8;
  (this->m_costName)._M_dataplus._M_p = (pointer)&(this->m_costName).field_2;
  pcVar1 = (costName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_costName,pcVar1,pcVar1 + costName->_M_string_length);
  return;
}

Assistant:

Cost::Cost(const std::string &costName)
            :m_costName(costName)
        { }